

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_setint(lua_State *L,Table *t,lua_Integer key,TValue *value)

{
  ushort uVar1;
  TValue *pTVar2;
  TValue k;
  Value local_30;
  undefined2 local_28;
  
  pTVar2 = luaH_getint(t,key);
  if (pTVar2 == &luaO_nilobject_) {
    local_28 = 0x13;
    local_30.i = key;
    pTVar2 = luaH_newkey(L,t,(TValue *)&local_30);
  }
  pTVar2->value_ = value->value_;
  uVar1 = value->tt_;
  pTVar2->tt_ = uVar1;
  if (((short)uVar1 < 0) &&
     (((uVar1 & 0x7f) != (ushort)((pTVar2->value_).gc)->tt ||
      ((L != (lua_State *)0x0 &&
       ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                  ,0x2f1,"void luaH_setint(lua_State *, Table *, lua_Integer, TValue *)");
  }
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, lua_Integer key, TValue *value) {
  const TValue *p = luaH_getint(t, key);
  TValue *cell;
  if (p != luaO_nilobject)
    cell = cast(TValue *, p);
  else {
    TValue k;
    setivalue(&k, key);
    cell = luaH_newkey(L, t, &k);
  }
  setobj2t(L, cell, value);
}